

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

bool __thiscall mkvparser::CuePoint::Load(CuePoint *this,IMkvReader *pReader)

{
  undefined1 auVar1 [16];
  CuePoint *pCVar2;
  bool bVar3;
  longlong lVar4;
  longlong lVar5;
  TrackPosition *this_00;
  long lVar6;
  long pos;
  long lVar7;
  long lVar8;
  TrackPosition *tp;
  ulong uVar9;
  long len;
  CuePoint *local_48;
  longlong local_40;
  longlong local_38;
  
  lVar7 = this->m_timecode;
  if (-1 < lVar7) {
    return true;
  }
  lVar4 = ReadID(pReader,-lVar7,&len);
  if (lVar4 != 0xbb) {
    return false;
  }
  lVar6 = len - lVar7;
  local_48 = this;
  local_40 = -lVar7;
  lVar4 = ReadUInt(pReader,lVar6,&len);
  lVar6 = lVar6 + len;
  lVar8 = lVar4 + lVar6;
  local_38 = lVar7 + lVar8;
  uVar9 = 0;
  lVar7 = lVar6;
  while( true ) {
    pCVar2 = local_48;
    if (lVar8 <= lVar7) {
      local_48->m_track_positions_count = uVar9;
      if (uVar9 == 0 || local_48->m_timecode < 0) {
        return false;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar9;
      uVar9 = 0xffffffffffffffff;
      if (SUB168(auVar1 * ZEXT816(0x18),8) == 0) {
        uVar9 = SUB168(auVar1 * ZEXT816(0x18),0);
      }
      this_00 = (TrackPosition *)operator_new__(uVar9,(nothrow_t *)&std::nothrow);
      pCVar2->m_track_positions = this_00;
      if (this_00 == (TrackPosition *)0x0) {
        return false;
      }
      do {
        if (lVar8 <= lVar6) {
          local_48->m_element_start = local_40;
          local_48->m_element_size = local_38;
          return true;
        }
        lVar4 = ReadID(pReader,lVar6,&len);
        if (lVar4 < 0) {
          return false;
        }
        lVar6 = lVar6 + len;
        if (lVar8 < lVar6) {
          return false;
        }
        lVar5 = ReadUInt(pReader,lVar6,&len);
        lVar6 = lVar6 + len;
        if (lVar4 == 0xb7) {
          bVar3 = TrackPosition::Parse(this_00,pReader,lVar6,lVar5);
          if (!bVar3) {
            return false;
          }
          this_00 = this_00 + 1;
        }
        lVar6 = lVar6 + lVar5;
      } while (lVar6 <= lVar8);
      return false;
    }
    lVar4 = ReadID(pReader,lVar7,&len);
    if (lVar4 < 0) {
      return false;
    }
    lVar7 = lVar7 + len;
    if (lVar8 < lVar7) break;
    lVar5 = ReadUInt(pReader,lVar7,&len);
    if (lVar5 < 0) {
      return false;
    }
    pos = lVar7 + len;
    if (lVar8 < pos) {
      return false;
    }
    lVar7 = pos + lVar5;
    if (lVar8 < lVar7) {
      return false;
    }
    if (lVar4 == 0xb7) {
      uVar9 = uVar9 + 1;
      if (uVar9 >> 0x20 != 0) {
        return true;
      }
    }
    else if (lVar4 == 0xb3) {
      lVar4 = UnserializeUInt(pReader,pos,lVar5);
      local_48->m_timecode = lVar4;
    }
  }
  return false;
}

Assistant:

bool CuePoint::Load(IMkvReader* pReader) {
  // odbgstream os;
  // os << "CuePoint::Load(begin): timecode=" << m_timecode << endl;

  if (m_timecode >= 0)  // already loaded
    return true;

  assert(m_track_positions == NULL);
  assert(m_track_positions_count == 0);

  long long pos_ = -m_timecode;
  const long long element_start = pos_;

  long long stop;

  {
    long len;

    const long long id = ReadID(pReader, pos_, len);
    if (id != libwebm::kMkvCuePoint)
      return false;

    pos_ += len;  // consume ID

    const long long size = ReadUInt(pReader, pos_, len);
    assert(size >= 0);

    pos_ += len;  // consume Size field
    // pos_ now points to start of payload

    stop = pos_ + size;
  }

  const long long element_size = stop - element_start;

  long long pos = pos_;

  // First count number of track positions
  unsigned long long track_positions_count = 0;
  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if ((id < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    if ((size < 0) || (pos + len > stop)) {
      return false;
    }

    pos += len;  // consume Size field
    if ((pos + size) > stop) {
      return false;
    }

    if (id == libwebm::kMkvCueTime)
      m_timecode = UnserializeUInt(pReader, pos, size);

    else if (id == libwebm::kMkvCueTrackPositions) {
      ++track_positions_count;
      if (track_positions_count > UINT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
  }

  m_track_positions_count = static_cast<size_t>(track_positions_count);

  if (m_timecode < 0 || m_track_positions_count <= 0) {
    return false;
  }

  // os << "CuePoint::Load(cont'd): idpos=" << idpos
  //   << " timecode=" << m_timecode
  //   << endl;

  m_track_positions = new (std::nothrow) TrackPosition[m_track_positions_count];
  if (m_track_positions == NULL)
    return false;

  // Now parse track positions

  TrackPosition* p = m_track_positions;
  pos = pos_;

  while (pos < stop) {
    long len;

    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return false;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);
    assert((pos + len) <= stop);

    pos += len;  // consume Size field
    assert((pos + size) <= stop);

    if (id == libwebm::kMkvCueTrackPositions) {
      TrackPosition& tp = *p++;
      if (!tp.Parse(pReader, pos, size)) {
        return false;
      }
    }

    pos += size;  // consume payload
    if (pos > stop)
      return false;
  }

  assert(size_t(p - m_track_positions) == m_track_positions_count);

  m_element_start = element_start;
  m_element_size = element_size;

  return true;
}